

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  uv_poll_t *puVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  uint uVar4;
  uv_os_sock_t extraout_EAX_00;
  uv_os_sock_t extraout_EAX_01;
  uv_os_sock_t extraout_EAX_02;
  uv_os_sock_t extraout_EAX_03;
  connection_context_t *handle;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  uv_loop_t *loop;
  void *pvVar7;
  ssize_t sVar8;
  int *piVar9;
  uint extraout_EDX;
  int iVar10;
  undefined4 uVar11;
  uv__queue **ppuVar12;
  uv_handle_t *handle_00;
  long *plVar13;
  code **ppcVar14;
  void *pvVar15;
  int64_t eval_b;
  int64_t eval_a;
  int yes;
  code *pcStack_108;
  undefined8 uStack_100;
  long lStack_f8;
  uv_loop_t *puStack_f0;
  code *pcStack_e8;
  void *pvStack_d8;
  void *pvStack_d0;
  uv_loop_t *puStack_c8;
  undefined8 uStack_98;
  undefined1 auStack_90 [16];
  uv__queue *puStack_68;
  uv_handle_t *puStack_60;
  socklen_t sStack_54;
  sockaddr sStack_50;
  uv__queue *puStack_40;
  uv__queue *local_30;
  uv__queue *local_28;
  uint local_1c;
  sockaddr local_18;
  
  puStack_40 = (uv__queue *)0x1b2715;
  uVar2 = socket(2,1,0);
  local_28 = (uv__queue *)(long)(int)uVar2;
  local_30 = (uv__queue *)0x0;
  if ((long)local_28 < 0) {
    puStack_40 = (uv__queue *)0x1b27b5;
    create_bound_socket_cold_3();
LAB_001b27b5:
    puStack_40 = (uv__queue *)0x1b27c4;
    create_bound_socket_cold_1();
  }
  else {
    local_1c = 1;
    puStack_40 = (uv__queue *)0x1b2755;
    iVar3 = setsockopt(uVar2,1,2,&local_1c,4);
    local_28 = (uv__queue *)(long)iVar3;
    local_30 = (uv__queue *)0x0;
    if (local_28 != (uv__queue *)0x0) goto LAB_001b27b5;
    puStack_40 = (uv__queue *)0x1b2782;
    iVar3 = bind(uVar2,&local_18,0x10);
    local_28 = (uv__queue *)(long)iVar3;
    local_30 = (uv__queue *)0x0;
    if (local_28 == (uv__queue *)0x0) {
      return uVar2;
    }
  }
  ppuVar12 = &local_28;
  puStack_40 = (uv__queue *)server_poll_cb;
  create_bound_socket_cold_2();
  puVar6 = (uv_loop_t *)*ppuVar12;
  sStack_54 = 0x10;
  puStack_40 = (uv__queue *)(ulong)uVar2;
  iVar3 = accept(*(int *)&(puVar6->watcher_queue).prev,&sStack_50,&sStack_54);
  puStack_60 = (uv_handle_t *)(long)iVar3;
  puStack_68 = (uv__queue *)0x0;
  if ((long)puStack_60 < 0) {
    server_poll_cb_cold_2();
  }
  else {
    handle = create_connection_context(iVar3,1);
    handle->events = 7;
    iVar3 = uv_poll_start(&handle->poll_handle,7,connection_poll_cb);
    puStack_60 = (uv_handle_t *)(long)iVar3;
    puStack_68 = (uv__queue *)0x0;
    if (puStack_60 == (uv_handle_t *)0x0) {
      iVar3 = *(int *)((long)&(puVar6->watcher_queue).prev + 4) + 1;
      *(int *)((long)&(puVar6->watcher_queue).prev + 4) = iVar3;
      if (iVar3 == 5) {
        close_socket(*(uv_os_sock_t *)&(puVar6->watcher_queue).prev);
        uv_close((uv_handle_t *)puVar6,server_close_cb);
        iVar3 = extraout_EAX;
      }
      return iVar3;
    }
  }
  iVar3 = (int)&puStack_60;
  uVar11 = SUB84(&puStack_68,0);
  server_poll_cb_cold_1();
  iVar10 = (int)&uStack_98;
  auStack_90._8_8_ = puVar6;
  puVar5 = (uv_loop_t *)malloc(0x130);
  if (puVar5 == (uv_loop_t *)0x0) {
    create_connection_context_cold_3();
LAB_001b2972:
    create_connection_context_cold_1();
  }
  else {
    *(int *)&(puVar5->wq_async).handle_queue.prev = iVar3;
    *(undefined4 *)&(puVar5->wq_async).async_cb = uVar11;
    (puVar5->wq_async).next_closing = (uv_handle_t *)0x0;
    *(undefined8 *)&(puVar5->wq_async).flags = 0;
    *(undefined8 *)((long)&(puVar5->wq_async).async_cb + 4) = 0;
    *(undefined8 *)((long)&(puVar5->wq_async).queue.next + 4) = 0;
    *(undefined8 *)((long)&(puVar5->wq_async).queue.prev + 4) = 0;
    puVar6 = uv_default_loop();
    iVar3 = uv_poll_init(puVar6,(uv_poll_t *)puVar5,iVar3);
    piVar9 = (int *)((long)&(puVar5->wq_async).async_cb + 4);
    *piVar9 = *piVar9 + 1;
    puVar5->data = puVar5;
    auStack_90._0_8_ = SEXT48(iVar3);
    uStack_98._0_4_ = 0;
    uStack_98._4_4_ = 0;
    puVar6 = puVar5;
    if ((void *)auStack_90._0_8_ != (void *)0x0) goto LAB_001b2972;
    loop = uv_default_loop();
    iVar3 = uv_timer_init(loop,(uv_timer_t *)&(puVar5->watcher_queue).prev);
    piVar9 = (int *)((long)&(puVar5->wq_async).async_cb + 4);
    *piVar9 = *piVar9 + 1;
    (puVar5->watcher_queue).prev = (uv__queue *)puVar5;
    auStack_90._0_8_ = SEXT48(iVar3);
    uStack_98._0_4_ = 0;
    uStack_98._4_4_ = 0;
    if ((void *)auStack_90._0_8_ == (void *)0x0) {
      return (uv_os_sock_t)puVar5;
    }
  }
  puVar5 = (uv_loop_t *)auStack_90;
  create_connection_context_cold_2();
  puVar1 = (uv_poll_t *)puVar5->data;
  pvStack_d0 = (void *)(long)iVar10;
  pvStack_d8 = (void *)0x0;
  puStack_c8 = puVar6;
  if (pvStack_d0 == (void *)0x0) {
    uVar2 = *(uint *)((long)&puVar1[2].handle_queue.next + 4);
    if ((uVar2 & extraout_EDX) == 0) goto LAB_001b3022;
    if ((~uVar2 & extraout_EDX) != 0) goto LAB_001b3027;
    if ((extraout_EDX & 1) == 0) goto switchD_001b2ba0_caseD_4;
    pcStack_e8 = (code *)0x1b2b64;
    iVar3 = rand();
    switch(iVar3 % 7) {
    case 0:
    case 1:
      do {
        pcStack_e8 = (code *)0x1b2bbf;
        sVar8 = recv(puVar1[1].io_watcher.fd,connection_poll_cb::buffer,0x4a,0);
        iVar3 = (int)sVar8;
        if (iVar3 != -1) break;
        pcStack_e8 = (code *)0x1b2bcd;
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      pvStack_d0 = (void *)(long)iVar3;
      pvStack_d8 = (void *)0x0;
      if (-1 < (long)pvStack_d0) {
        if (iVar3 < 1) goto LAB_001b2d1a;
        puVar1[2].data = (void *)((long)puVar1[2].data + (long)pvStack_d0);
        break;
      }
      goto LAB_001b304f;
    case 2:
    case 3:
      do {
        while( true ) {
          pcStack_e8 = (code *)0x1b2cd5;
          sVar8 = recv(puVar1[1].io_watcher.fd,connection_poll_cb::buffer_1,0x3a3,0);
          uVar4 = (uint)sVar8;
          if (uVar4 == 0xffffffff) break;
          if ((int)uVar4 < 1) {
            if (uVar4 == 0) goto LAB_001b2d1a;
            pcStack_e8 = (code *)0x1b2d01;
            piVar9 = __errno_location();
            iVar3 = *piVar9;
            goto LAB_001b2d03;
          }
          puVar1[2].data = (void *)((long)puVar1[2].data + (ulong)(uVar4 & 0x7fffffff));
        }
        pcStack_e8 = (code *)0x1b2cf1;
        piVar9 = __errno_location();
        iVar3 = *piVar9;
      } while (iVar3 == 4);
LAB_001b2d03:
      if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
        pcStack_e8 = (code *)0x1b2d1a;
        connection_poll_cb_cold_3();
LAB_001b2d1a:
        *(undefined4 *)&puVar1[2].close_cb = 1;
        uVar2 = uVar2 & 0xfffffffe;
      }
      break;
    case 4:
      break;
    case 5:
      uVar2 = uVar2 & 0xfffffffe;
      pcStack_e8 = (code *)0x1b2d3f;
      iVar3 = uv_is_active((uv_handle_t *)(puVar1 + 1));
      if (iVar3 == 0) {
        *(undefined4 *)&puVar1[2].handle_queue.prev = 1;
        pcStack_e8 = (code *)0x1b2e14;
        uv_timer_start((uv_timer_t *)(puVar1 + 1),delay_timer_cb,10,0);
      }
      else {
        ppuVar12 = &puVar1[2].handle_queue.prev;
        *(byte *)ppuVar12 = *(byte *)ppuVar12 | 1;
      }
      break;
    case 6:
      pcStack_e8 = (code *)0x1b2d6b;
      uv_poll_start(puVar1,2,connection_poll_cb);
      pcStack_e8 = (code *)0x1b2d7b;
      uv_poll_start(puVar1,1,connection_poll_cb);
      *(undefined4 *)((long)&puVar1[2].handle_queue.next + 4) = 1;
      break;
    default:
      goto switchD_001b2ba0_default;
    }
switchD_001b2ba0_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_001b2c49_caseD_4;
    if ((puVar1[2].loop < (uv_loop_t *)0x10000) &&
       ((test_mode != '\x01' || (puVar1[2].type == UV_UNKNOWN_HANDLE)))) {
      pcStack_e8 = (code *)0x1b2c0d;
      iVar3 = rand();
      switch(iVar3 % 7) {
      case 0:
      case 1:
        pvVar7 = (void *)(0x10000 - (long)puVar1[2].loop);
        pvVar15 = (void *)0x67;
        if (pvVar7 < (void *)0x67) {
          pvVar15 = pvVar7;
        }
        pvStack_d8 = (void *)0x0;
        pvStack_d0 = pvVar15;
        if (0 < (long)pvVar15) {
          do {
            pcStack_e8 = (code *)0x1b2c9e;
            sVar8 = send(puVar1[1].io_watcher.fd,connection_poll_cb::buffer_2,(size_t)pvVar15,0);
            uVar4 = (uint)sVar8;
            if (uVar4 != 0xffffffff) {
              if (-1 < (int)uVar4) {
                pvStack_d0 = (void *)(ulong)(uVar4 & 0x7fffffff);
                pvStack_d8 = (void *)0x0;
                if (pvStack_d0 == (void *)0x0) goto LAB_001b308b;
                puVar1[2].loop =
                     (uv_loop_t *)((long)pvStack_d0 + (long)((puVar1[2].loop)->reserved + -7));
                valid_writable_wakeups = valid_writable_wakeups + 1;
                goto switchD_001b2c49_caseD_4;
              }
              pcStack_e8 = (code *)0x1b2f9e;
              piVar9 = __errno_location();
              iVar3 = *piVar9;
              break;
            }
            pcStack_e8 = (code *)0x1b2cac;
            piVar9 = __errno_location();
            iVar3 = *piVar9;
          } while (iVar3 == 4);
          if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
            pcStack_e8 = (code *)0x1b2faf;
            connection_poll_cb_cold_15();
LAB_001b2faf:
            pcStack_e8 = (code *)0x1b2fb4;
            piVar9 = __errno_location();
            iVar3 = *piVar9;
            goto LAB_001b2fb6;
          }
LAB_001b2fc4:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        goto LAB_001b3063;
      case 2:
      case 3:
        pvVar15 = (void *)(0x10000 - (long)puVar1[2].loop);
        if ((void *)0x4d1 < pvVar15) {
          pvVar15 = (void *)0x4d2;
        }
        pvStack_d8 = (void *)0x0;
        pvStack_d0 = pvVar15;
        if ((long)pvVar15 < 1) goto LAB_001b3072;
        do {
          pcStack_e8 = (code *)0x1b2ddd;
          sVar8 = send(puVar1[1].io_watcher.fd,connection_poll_cb::buffer_3,(size_t)pvVar15,0);
          uVar4 = (uint)sVar8;
          if (uVar4 != 0xffffffff) {
            if ((int)uVar4 < 0) goto LAB_001b2faf;
            pvStack_d0 = (void *)(ulong)(uVar4 & 0x7fffffff);
            pvStack_d8 = (void *)0x0;
            if (pvStack_d0 == (void *)0x0) goto LAB_001b309a;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            puVar6 = (uv_loop_t *)((long)pvStack_d0 + (long)puVar1[2].loop);
            puVar1[2].loop = puVar6;
            goto joined_r0x001b2e9b;
          }
          pcStack_e8 = (code *)0x1b2de7;
          piVar9 = __errno_location();
          iVar3 = *piVar9;
        } while (iVar3 == 4);
LAB_001b2fb6:
        if ((iVar3 == 0xb) || (iVar3 == 0x73)) goto LAB_001b2fc4;
        goto LAB_001b3086;
      case 4:
        break;
      case 5:
        uVar2 = uVar2 & 0xfffffffd;
        pcStack_e8 = (code *)0x1b2f51;
        iVar3 = uv_is_active((uv_handle_t *)(puVar1 + 1));
        if (iVar3 == 0) {
          *(undefined4 *)&puVar1[2].handle_queue.prev = 2;
          pcStack_e8 = (code *)0x1b2ff0;
          uv_timer_start((uv_timer_t *)(puVar1 + 1),delay_timer_cb,100,0);
        }
        else {
          ppuVar12 = &puVar1[2].handle_queue.prev;
          *(byte *)ppuVar12 = *(byte *)ppuVar12 | 2;
        }
        break;
      case 6:
        pcStack_e8 = (code *)0x1b2f79;
        uv_poll_start(puVar1,1,connection_poll_cb);
        pcStack_e8 = (code *)0x1b2f89;
        uv_poll_start(puVar1,2,connection_poll_cb);
        *(undefined4 *)((long)&puVar1[2].handle_queue.next + 4) = 2;
        break;
      default:
        goto switchD_001b2c49_default;
      }
switchD_001b2c49_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)&puVar1[2].handle_queue.next = 1;
        disconnects = disconnects + 1;
        uVar2 = uVar2 & 0xfffffffb;
      }
      if (((*(int *)&puVar1[2].close_cb == 0) || (*(int *)((long)&puVar1[2].close_cb + 4) == 0)) ||
         (*(int *)&puVar1[2].handle_queue.next == 0)) {
        if (uVar2 != *(uint *)((long)&puVar1[2].handle_queue.next + 4)) {
          *(uint *)((long)&puVar1[2].handle_queue.next + 4) = uVar2;
          pcStack_e8 = (code *)0x1b2aea;
          uv_poll_start((uv_poll_t *)puVar5,uVar2,connection_poll_cb);
          uVar2 = *(uint *)((long)&puVar1[2].handle_queue.next + 4);
        }
        if (uVar2 != 0) {
          pvStack_d0 = (void *)0x1;
          pcStack_e8 = (code *)0x1b2b06;
          iVar3 = uv_is_active((uv_handle_t *)puVar5);
          pvStack_d8 = (void *)(long)iVar3;
          if (pvStack_d0 == pvStack_d8) goto LAB_001b2b50;
          pcStack_e8 = (code *)0x1b2b28;
          connection_poll_cb_cold_17();
        }
      }
      else {
        pcStack_e8 = (code *)0x1b2a9b;
        close_socket(puVar1[1].io_watcher.fd);
        pcStack_e8 = (code *)0x1b2aad;
        uv_close((uv_handle_t *)puVar1,connection_close_cb);
        pcStack_e8 = (code *)0x1b2abc;
        uv_close((uv_handle_t *)(puVar1 + 1),connection_close_cb);
        *(undefined4 *)((long)&puVar1[2].handle_queue.next + 4) = 0;
      }
      pcStack_e8 = (code *)0x1b2b30;
      iVar3 = uv_is_active((uv_handle_t *)puVar5);
      pvStack_d0 = (void *)(long)iVar3;
      pvStack_d8 = (void *)0x0;
      if (pvStack_d0 == (void *)0x0) {
LAB_001b2b50:
        return (uv_os_sock_t)pvStack_d0;
      }
      goto LAB_001b302c;
    }
    pcStack_e8 = (code *)0x1b2a29;
    iVar3 = shutdown(puVar1[1].io_watcher.fd,1);
    pvStack_d0 = (void *)(long)iVar3;
    pvStack_d8 = (void *)0x0;
    if (pvStack_d0 == (void *)0x0) {
      *(undefined4 *)((long)&puVar1[2].close_cb + 4) = 1;
      uVar2 = uVar2 & 0xfffffffd;
      pvStack_d0 = (void *)0x0;
      goto switchD_001b2c49_caseD_4;
    }
  }
  else {
LAB_001b3013:
    pcStack_e8 = (code *)0x1b3022;
    connection_poll_cb_cold_1();
LAB_001b3022:
    pcStack_e8 = (code *)0x1b3027;
    connection_poll_cb_cold_19();
LAB_001b3027:
    puVar5 = puVar6;
    pcStack_e8 = (code *)0x1b302c;
    connection_poll_cb_cold_2();
LAB_001b302c:
    pcStack_e8 = (code *)0x1b303b;
    connection_poll_cb_cold_18();
  }
  pcStack_e8 = (code *)0x1b304a;
  connection_poll_cb_cold_6();
LAB_001b304a:
  pcStack_e8 = (code *)0x1b304f;
  connection_poll_cb_cold_10();
LAB_001b304f:
  pcStack_e8 = (code *)0x1b305e;
  connection_poll_cb_cold_4();
switchD_001b2ba0_default:
  pcStack_e8 = (code *)0x1b3063;
  connection_poll_cb_cold_5();
LAB_001b3063:
  pcStack_e8 = (code *)0x1b3072;
  connection_poll_cb_cold_13();
LAB_001b3072:
  pcStack_e8 = (code *)0x1b3081;
  connection_poll_cb_cold_7();
switchD_001b2c49_default:
  pcStack_e8 = (code *)0x1b3086;
  connection_poll_cb_cold_16();
LAB_001b3086:
  pcStack_e8 = (code *)0x1b308b;
  connection_poll_cb_cold_12();
LAB_001b308b:
  pcStack_e8 = (code *)0x1b309a;
  connection_poll_cb_cold_14();
LAB_001b309a:
  pcStack_e8 = (code *)0x1b30a9;
  connection_poll_cb_cold_8();
LAB_001b30a9:
  handle_00 = (uv_handle_t *)&pvStack_d0;
  pcStack_e8 = close_socket;
  connection_poll_cb_cold_9();
  puStack_f0 = (uv_loop_t *)0x1b30be;
  pcStack_e8._0_4_ = extraout_EAX_00;
  iVar3 = close((int)handle_00);
  if (iVar3 == 0) {
    return (uv_os_sock_t)pcStack_e8;
  }
  puStack_f0 = (uv_loop_t *)0x1b30c7;
  piVar9 = __errno_location();
  if (*piVar9 == 0x68) {
    return (uv_os_sock_t)pcStack_e8;
  }
  puStack_f0 = (uv_loop_t *)delay_timer_cb;
  close_socket_cold_1();
  puVar1 = (uv_poll_t *)handle_00->data;
  pcStack_108 = (code *)0x1b30e0;
  puStack_f0 = puVar5;
  iVar3 = uv_is_active(handle_00);
  lStack_f8 = (long)iVar3;
  uStack_100 = 0;
  if (lStack_f8 == 0) {
    uVar2 = *(uint *)&puVar1[2].handle_queue.prev;
    if (uVar2 == 0) goto LAB_001b3156;
    uVar2 = uVar2 | *(uint *)((long)&puVar1[2].handle_queue.next + 4);
    *(uint *)((long)&puVar1[2].handle_queue.next + 4) = uVar2;
    *(undefined4 *)&puVar1[2].handle_queue.prev = 0;
    pcStack_108 = (code *)0x1b3129;
    iVar3 = uv_poll_start(puVar1,uVar2,connection_poll_cb);
    lStack_f8 = (long)iVar3;
    uStack_100 = 0;
    if (lStack_f8 == 0) {
      return iVar3;
    }
  }
  else {
    pcStack_108 = (code *)0x1b3156;
    delay_timer_cb_cold_1();
LAB_001b3156:
    pcStack_108 = (code *)0x1b315b;
    delay_timer_cb_cold_3();
  }
  plVar13 = &lStack_f8;
  pcStack_108 = connection_close_cb;
  delay_timer_cb_cold_2();
  ppcVar14 = (code **)*plVar13;
  piVar9 = (int *)((long)ppcVar14 + 0x114);
  *piVar9 = *piVar9 + -1;
  if (*piVar9 != 0) {
    return extraout_EAX_01;
  }
  if (test_mode == '\x01') {
    if (*(int *)(ppcVar14 + 0x22) != 0) {
      pcStack_108 = ppcVar14[0x20];
      if (pcStack_108 == (code *)0x10000) {
        pcStack_108 = ppcVar14[0x21];
        if (pcStack_108 == (code *)0x0) goto LAB_001b3259;
        ppcVar14 = &pcStack_108;
        connection_close_cb_cold_2();
        goto LAB_001b31e7;
      }
      goto LAB_001b3208;
    }
LAB_001b3217:
    pcStack_108 = ppcVar14[0x20];
    if (ppcVar14[0x20] != (code *)0x0) goto LAB_001b3277;
  }
  else {
LAB_001b31e7:
    pcStack_108 = ppcVar14[0x20];
    if (ppcVar14[0x20] != (code *)0x10000) {
LAB_001b3208:
      ppcVar14 = &pcStack_108;
      connection_close_cb_cold_1();
      goto LAB_001b3217;
    }
  }
  pcStack_108 = ppcVar14[0x21];
  if (pcStack_108 == (code *)0x10000) {
LAB_001b3259:
    closed_connections = closed_connections + 1;
    free(ppcVar14);
    return extraout_EAX_02;
  }
  connection_close_cb_cold_4();
LAB_001b3277:
  ppcVar14 = &pcStack_108;
  connection_close_cb_cold_3();
  free(*ppcVar14);
  return extraout_EAX_03;
joined_r0x001b2e9b:
  if ((uv_loop_t *)0xffff < puVar6) goto switchD_001b2c49_caseD_4;
  pvVar15 = (void *)(0x10000 - (long)puVar6);
  if (puVar6 < (uv_loop_t *)0xfb2f) {
    pvVar15 = (void *)0x4d2;
  }
  pvStack_d8 = (void *)0x0;
  pvStack_d0 = pvVar15;
  if ((long)pvVar15 < 1) goto LAB_001b30a9;
  while( true ) {
    pcStack_e8 = (code *)0x1b2ef2;
    sVar8 = send(puVar1[1].io_watcher.fd,connection_poll_cb::buffer_3,(size_t)pvVar15,0);
    uVar4 = (uint)sVar8;
    if (uVar4 != 0xffffffff) break;
    pcStack_e8 = (code *)0x1b2efc;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    if (iVar3 != 4) goto LAB_001b2ffc;
  }
  if (uVar4 == 0) goto LAB_001b304a;
  if ((int)uVar4 < 0) {
    pcStack_e8 = (code *)0x1b2ffa;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
LAB_001b2ffc:
    if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
      pcStack_e8 = (code *)0x1b3013;
      connection_poll_cb_cold_11();
      puVar6 = puVar5;
      goto LAB_001b3013;
    }
    goto switchD_001b2c49_caseD_4;
  }
  puVar6 = (uv_loop_t *)((long)(puVar1[2].loop)->reserved + ((ulong)(uVar4 & 0x7fffffff) - 0x38));
  puVar1[2].loop = puVar6;
  goto joined_r0x001b2e9b;
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT_OK(r);

  return sock;
}